

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
TransitionObservationIndependentMADPDiscrete::JointToIndividualStateIndices
          (TransitionObservationIndependentMADPDiscrete *this,Index jointSI)

{
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
  *this_00;
  iterator iVar1;
  _Base_ptr *pp_Var2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ind_sI;
  Index local_5c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_40;
  
  if (this->_m_jointIndicesCached == true) {
    pp_Var2 = (_Base_ptr *)
              ((this->_m_indivStateIndices).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + jointSI);
  }
  else {
    local_5c = jointSI;
    iVar1 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::find(&this->_m_indivStateIndicesMap->_M_t,&local_5c);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(this->_m_indivStateIndicesMap->_M_t)._M_impl.super__Rb_tree_header) {
      IndexTools::JointToIndividualIndicesStepSize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,local_5c,
                 &this->_m_stateStepSize);
      this_00 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                 *)this->_m_indivStateIndicesMap;
      local_40.first = local_5c;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_40.second,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
      ::
      _M_emplace_unique<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (this_00,&local_40);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&local_40.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      iVar1 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::find(&this->_m_indivStateIndicesMap->_M_t,&local_5c);
      pp_Var2 = &iVar1._M_node[1]._M_parent;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
    }
    else {
      iVar1 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::find(&this->_m_indivStateIndicesMap->_M_t,&local_5c);
      pp_Var2 = &iVar1._M_node[1]._M_parent;
    }
  }
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pp_Var2;
}

Assistant:

const std::vector<Index>& JointToIndividualStateIndices(Index jointSI) const
        {
            if(_m_jointIndicesCached)
                return _m_indivStateIndices[jointSI];
            else if (_m_indivStateIndicesMap->find(jointSI)!=
                     _m_indivStateIndicesMap->end())
                return(_m_indivStateIndicesMap->find(jointSI)->second);
            else
            {
                std::vector<Index> ind_sI=
                    IndexTools::JointToIndividualIndicesStepSize(jointSI,_m_stateStepSize);
                _m_indivStateIndicesMap->insert(make_pair(jointSI,ind_sI));
                return(_m_indivStateIndicesMap->find(jointSI)->second);
            }
        }